

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ReflectionSchema *this;
  uint32_t uVar1;
  uint32_t uVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  LogFinisher local_71;
  uint32_t local_70;
  uint32_t local_6c;
  LogMessage local_68;
  
  this = &r->schema_;
  local_6c = ReflectionSchema::GetFieldOffset(this,field);
  local_70 = ReflectionSchema::GetFieldOffset(this,field);
  ReflectionSchema::InlinedStringIndex(this,field);
  if ((r->schema_).has_bits_offset_ == -1) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x99d);
    pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasHasbits(): ");
    LogFinisher::operator=(&local_71,pLVar3);
    LogMessage::~LogMessage(&local_68);
  }
  ReflectionSchema::InlinedStringDonatedOffset(this);
  if ((r->schema_).has_bits_offset_ == -1) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x99d);
    pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasHasbits(): ");
    LogFinisher::operator=(&local_71,pLVar3);
    LogMessage::~LogMessage(&local_68);
  }
  ReflectionSchema::InlinedStringDonatedOffset(this);
  if ((r->schema_).inlined_string_donated_offset_ == -1) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x997);
    pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasInlinedString(): ");
    LogFinisher::operator=(&local_71,pLVar3);
    LogMessage::~LogMessage(&local_68);
  }
  uVar1 = ReflectionSchema::InlinedStringDonatedOffset(this);
  uVar2 = ReflectionSchema::InlinedStringIndex(this,field);
  anon_unknown_0::IsIndexInHasBitSet
            ((uint32_t *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),uVar2);
  if ((r->schema_).inlined_string_donated_offset_ == -1) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x997);
    pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasInlinedString(): ");
    LogFinisher::operator=(&local_71,pLVar3);
    LogMessage::~LogMessage(&local_68);
  }
  uVar4 = (ulong)local_6c;
  uVar1 = ReflectionSchema::InlinedStringDonatedOffset(this);
  uVar2 = ReflectionSchema::InlinedStringIndex(this,field);
  anon_unknown_0::IsIndexInHasBitSet
            ((uint32_t *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),uVar2);
  std::__cxx11::string::swap((string *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar4));
  return;
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArenaForAllocation();
  Arena* rhs_arena = rhs->GetArenaForAllocation();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  const uint32 index = r->schema_.InlinedStringIndex(field);
  uint32* lhs_state = &r->MutableInlinedStringDonatedArray(lhs)[index / 32];
  uint32* rhs_state = &r->MutableInlinedStringDonatedArray(rhs)[index / 32];
  const uint32 mask = ~(static_cast<uint32>(1) << (index % 32));
  if (unsafe_shallow_swap || lhs_arena == rhs_arena) {
    lhs_string->Swap(rhs_string, /*default_value=*/nullptr, lhs_arena,
                     r->IsInlinedStringDonated(*lhs, field),
                     r->IsInlinedStringDonated(*rhs, field),
                     /*donating_states=*/lhs_state, rhs_state, mask);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(nullptr, rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask);
    rhs_string->Set(nullptr, temp, rhs_arena,
                    r->IsInlinedStringDonated(*rhs, field), rhs_state, mask);
  }
}